

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> * __thiscall
wallet::CWallet::GetActiveHDPubKeys
          (set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
           *__return_storage_ptr__,CWallet *this)

{
  _Rb_tree_header *p_Var1;
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> desc_xpubs;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> desc_pubkeys;
  WalletDescriptor w_desc;
  unique_lock<std::recursive_mutex> local_1c8;
  _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
  local_1b8;
  _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
  local_188;
  WalletDescriptor local_158;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_158.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       (byte)((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22) & 1;
  inline_assertion_check<true,bool>
            ((bool *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x11eb,"GetActiveHDPubKeys","IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)");
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  GetActiveScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_68,this);
  p_Var2 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &local_68._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if (*(long *)(p_Var2 + 1) == 0) break;
    this_00 = (DescriptorScriptPubKeyMan *)
              __dynamic_cast(*(long *)(p_Var2 + 1),&ScriptPubKeyMan::typeinfo,
                             &DescriptorScriptPubKeyMan::typeinfo,0);
    if (this_00 == (DescriptorScriptPubKeyMan *)0x0) break;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_1c8,&this_00->cs_desc_man
               ,"desc_spkm->cs_desc_man",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x11f1,false);
    DescriptorScriptPubKeyMan::GetWalletDescriptor(&local_158,this_00);
    local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_188._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_188._M_impl.super__Rb_tree_header._M_header;
    local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1b8._M_impl.super__Rb_tree_header._M_header;
    local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_188._M_impl.super__Rb_tree_header._M_header._M_right =
         local_188._M_impl.super__Rb_tree_header._M_header._M_left;
    (**(code **)(*(long *)CONCAT71(local_158.descriptor.
                                   super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                   ._1_7_,(byte)local_158.descriptor.
                                                super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr) + 0x78))
              ((long *)CONCAT71(local_158.descriptor.
                                super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                                _1_7_,(byte)local_158.descriptor.
                                            super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr),&local_188,&local_1b8);
    std::
    _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
    ::_M_merge_unique<std::less<CExtPubKey>>
              ((_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                *)__return_storage_ptr__,&local_1b8);
    std::
    _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
    ::~_Rb_tree(&local_1b8);
    std::
    _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_std::less<CPubKey>,_std::allocator<CPubKey>_>
    ::~_Rb_tree(&local_188);
    WalletDescriptor::~WalletDescriptor(&local_158);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_1c8);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
  }
  __assert_fail("desc_spkm",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                ,0x11f0,"std::set<CExtPubKey> wallet::CWallet::GetActiveHDPubKeys() const");
}

Assistant:

std::set<CExtPubKey> CWallet::GetActiveHDPubKeys() const
{
    AssertLockHeld(cs_wallet);

    Assert(IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    std::set<CExtPubKey> active_xpubs;
    for (const auto& spkm : GetActiveScriptPubKeyMans()) {
        const DescriptorScriptPubKeyMan* desc_spkm = dynamic_cast<DescriptorScriptPubKeyMan*>(spkm);
        assert(desc_spkm);
        LOCK(desc_spkm->cs_desc_man);
        WalletDescriptor w_desc = desc_spkm->GetWalletDescriptor();

        std::set<CPubKey> desc_pubkeys;
        std::set<CExtPubKey> desc_xpubs;
        w_desc.descriptor->GetPubKeys(desc_pubkeys, desc_xpubs);
        active_xpubs.merge(std::move(desc_xpubs));
    }
    return active_xpubs;
}